

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_empty_result.cpp
# Opt level: O3

void __thiscall
duckdb::LogicalEmptyResult::LogicalEmptyResult
          (LogicalEmptyResult *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  pointer pCVar1;
  pointer pLVar2;
  pointer local_38;
  pointer pCStack_30;
  pointer local_28;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,LOGICAL_EMPTY_RESULT);
  (this->super_LogicalOperator)._vptr_LogicalOperator =
       (_func_int **)&PTR__LogicalEmptyResult_0244dc70;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->return_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  (*pLVar2->_vptr_LogicalOperator[2])(&local_38,pLVar2);
  pCVar1 = (this->bindings).
           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start = local_38;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish = pCStack_30;
  (this->bindings).super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (pointer)0x0;
  pCStack_30 = (pointer)0x0;
  local_28 = (pointer)0x0;
  if (pCVar1 != (pointer)0x0) {
    operator_delete(pCVar1);
    if (local_38 != (pointer)0x0) {
      operator_delete(local_38);
    }
  }
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  LogicalOperator::ResolveOperatorTypes(pLVar2);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(op);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &this->return_types,
             &(pLVar2->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

LogicalEmptyResult::LogicalEmptyResult(unique_ptr<LogicalOperator> op)
    : LogicalOperator(LogicalOperatorType::LOGICAL_EMPTY_RESULT) {

	this->bindings = op->GetColumnBindings();

	op->ResolveOperatorTypes();
	this->return_types = op->types;
}